

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

optional_ptr<duckdb::CreateSecretFunction,_true> __thiscall
duckdb::SecretManager::LookupFunctionInternal(SecretManager *this,string *type,string *provider)

{
  bool bVar1;
  iterator iVar2;
  CreateSecretFunction *pCVar3;
  CreateSecretFunctionSet *this_00;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_38;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_38,&this->manager_lock);
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->secret_functions)._M_h,type);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_019a1e5f:
    ::std::unique_lock<std::mutex>::unlock(&uStack_38);
    AutoloadExtensionForFunction(this,type,provider);
    ::std::unique_lock<std::mutex>::lock(&uStack_38);
    iVar2 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->secret_functions)._M_h,type);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>,_true>
        ._M_cur != (__node_type *)0x0) {
      this_00 = (CreateSecretFunctionSet *)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>,_true>
                       ._M_cur + 0x28);
      bVar1 = CreateSecretFunctionSet::ProviderExists(this_00,provider);
      if (bVar1) goto LAB_019a1ea3;
    }
    pCVar3 = (CreateSecretFunction *)0x0;
  }
  else {
    this_00 = (CreateSecretFunctionSet *)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunctionSet>,_true>
                     ._M_cur + 0x28);
    bVar1 = CreateSecretFunctionSet::ProviderExists(this_00,provider);
    if (!bVar1) goto LAB_019a1e5f;
LAB_019a1ea3:
    pCVar3 = CreateSecretFunctionSet::GetFunction(this_00,provider);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  return (optional_ptr<duckdb::CreateSecretFunction,_true>)pCVar3;
}

Assistant:

optional_ptr<CreateSecretFunction> SecretManager::LookupFunctionInternal(const string &type, const string &provider) {
	unique_lock<mutex> lck(manager_lock);
	auto lookup = secret_functions.find(type);

	if (lookup != secret_functions.end()) {
		if (lookup->second.ProviderExists(provider)) {
			return &lookup->second.GetFunction(provider);
		}
	}

	// Try autoloading
	lck.unlock();
	AutoloadExtensionForFunction(type, provider);
	lck.lock();

	lookup = secret_functions.find(type);

	if (lookup != secret_functions.end()) {
		if (lookup->second.ProviderExists(provider)) {
			return &lookup->second.GetFunction(provider);
		}
	}

	return nullptr;
}